

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_BlitRectX(GPU_Image *image,GPU_Rect *src_rect,GPU_Target *target,GPU_Rect *dest_rect,
                  float degrees,float pivot_x,float pivot_y,GPU_FlipEnum flip_direction)

{
  float local_58;
  float local_54;
  float scale_y;
  float scale_x;
  float dh;
  float dw;
  float dy;
  float dx;
  float h;
  float w;
  GPU_FlipEnum flip_direction_local;
  float pivot_y_local;
  float pivot_x_local;
  float degrees_local;
  GPU_Rect *dest_rect_local;
  GPU_Target *target_local;
  GPU_Rect *src_rect_local;
  GPU_Image *image_local;
  
  if ((image != (GPU_Image *)0x0) && (target != (GPU_Target *)0x0)) {
    if (src_rect == (GPU_Rect *)0x0) {
      dx = (float)image->w;
      dy = (float)image->h;
    }
    else {
      dx = src_rect->w;
      dy = src_rect->h;
    }
    if (dest_rect == (GPU_Rect *)0x0) {
      dw = 0.0;
      dh = 0.0;
      scale_x = (float)target->w;
      scale_y = (float)target->h;
    }
    else {
      dw = dest_rect->x;
      dh = dest_rect->y;
      scale_x = dest_rect->w;
      scale_y = dest_rect->h;
    }
    local_54 = scale_x / dx;
    local_58 = scale_y / dy;
    flip_direction_local = (GPU_FlipEnum)pivot_x;
    if ((flip_direction & 1) != 0) {
      local_54 = -local_54;
      dw = scale_x + dw;
      flip_direction_local = (GPU_FlipEnum)(dx - pivot_x);
    }
    w = pivot_y;
    if ((flip_direction & 2) != 0) {
      local_58 = -local_58;
      dh = scale_y + dh;
      w = dy - pivot_y;
    }
    GPU_BlitTransformX(image,src_rect,target,(float)flip_direction_local * local_54 + dw,
                       w * local_58 + dh,(float)flip_direction_local,w,degrees,local_54,local_58);
  }
  return;
}

Assistant:

void GPU_BlitRectX(GPU_Image* image, GPU_Rect* src_rect, GPU_Target* target, GPU_Rect* dest_rect, float degrees, float pivot_x, float pivot_y, GPU_FlipEnum flip_direction)
{
    float w, h;
    float dx, dy;
    float dw, dh;
    float scale_x, scale_y;
    
    if(image == NULL || target == NULL)
        return;
    
    if(src_rect == NULL)
    {
        w = image->w;
        h = image->h;
    }
    else
    {
        w = src_rect->w;
        h = src_rect->h;
    }
    
    if(dest_rect == NULL)
    {
        dx = 0.0f;
        dy = 0.0f;
        dw = target->w;
        dh = target->h;
    }
    else
    {
        dx = dest_rect->x;
        dy = dest_rect->y;
        dw = dest_rect->w;
        dh = dest_rect->h;
    }
    
    scale_x = dw / w;
    scale_y = dh / h;
    
    if(flip_direction & GPU_FLIP_HORIZONTAL)
    {
        scale_x = -scale_x;
        dx += dw;
        pivot_x = w - pivot_x;
    }
    if(flip_direction & GPU_FLIP_VERTICAL)
    {
        scale_y = -scale_y;
        dy += dh;
        pivot_y = h - pivot_y;
    }
    
    GPU_BlitTransformX(image, src_rect, target, dx + pivot_x * scale_x, dy + pivot_y * scale_y, pivot_x, pivot_y, degrees, scale_x, scale_y);
}